

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::read_numerics::~read_numerics(read_numerics *this)

{
  read_numerics *this_local;
  
  compile_fixture_skiwi::~compile_fixture_skiwi((compile_fixture_skiwi *)this);
  return;
}

Assistant:

void test()
      {
      build_srfi6();
      build_csv();
      TEST_EQ("-8.97873e-05", run("(string->number \"-8.9787310571409761906e-05\")"));

      TEST_EQ("<port>: \"input-string\"", run("(define p (open-input-string \"(0.98718667030334472656 -8.9787310571409761906e-05 0.37939864397048950195)\"))"));
      TEST_EQ("(0.987187 -8.97873e-05 0.379399)", run("(read p)"));

      TEST_EQ("<port>: \"input-string\"", run("(define p (open-input-string \"1,2,3\"))"));
      TEST_EQ("\"1,2,3\"", run("(read-line p)"));

      TEST_EQ("<port>: \"input-string\"", run("(define p (open-input-string \"1,2,3\"))"));
      TEST_EQ("(\"1\" \"2\" \"3\")", run("(parse-line (open-input-string (read-line p)))"));

      TEST_EQ("<port>: \"input-string\"", run("(define p (open-input-string \"-64.329442,52.656052,-48.669564\"))"));
      TEST_EQ("\"-64.329442,52.656052,-48.669564\"", run("(read-line p)"));

      TEST_EQ("<port>: \"input-string\"", run("(define p (open-input-string \"-64.329442,52.656052,-48.669564\"))"));
      TEST_EQ("(\"-64.329442\" \"52.656052\" \"-48.669564\")", run("(parse-line (open-input-string (read-line p)))"));

      //TEST_EQ("1", run("(read p)"));
      //TEST_EQ(",", run("(%read-identifier (read-char p) p)"));
      //TEST_EQ("2", run("(read p)"));
      //TEST_EQ(",", run("(read p)"));
      //TEST_EQ("3", run("(read p)"));      

      //TEST_EQ("<port>: \"input-string\"", run("(define p (open-input-string \"-64.329442,52.656052,-48.669564\"))"));
      //TEST_EQ("-64.3294", run("(read p)"));
      //TEST_EQ(",", run("(read p)"));
      }